

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O1

uint8 * google::protobuf::internal::WireFormatLite::WriteFixedNoTagToArray<double>
                  (RepeatedField<double> *value,_func_uint8_ptr_double_uint8_ptr *Writer,
                  uint8 *target)

{
  int iVar1;
  LogMessage *pLVar2;
  size_t __n;
  LogFinisher local_99;
  LogMessage local_98;
  LogMessage local_60;
  
  iVar1 = value->current_size_;
  if (iVar1 < 1) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite_inl.h"
               ,0x2b7);
    pLVar2 = LogMessage::operator<<(&local_60,"CHECK failed: (n) > (0): ");
    LogFinisher::operator=((LogFinisher *)&local_98,pLVar2);
    LogMessage::~LogMessage(&local_60);
  }
  if (value->rep_ == (Rep *)0x0) {
    LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4e2);
    pLVar2 = LogMessage::operator<<(&local_98,"CHECK failed: rep_: ");
    LogFinisher::operator=(&local_99,pLVar2);
    LogMessage::~LogMessage(&local_98);
  }
  __n = (size_t)(iVar1 << 3);
  memcpy(target,value->rep_->elements,__n);
  return target + __n;
}

Assistant:

inline uint8* WireFormatLite::WriteFixedNoTagToArray(
      const RepeatedField<T>& value,
      uint8* (*Writer)(T, uint8*), uint8* target) {
#if defined(PROTOBUF_LITTLE_ENDIAN)
  (void) Writer;

  const int n = value.size();
  GOOGLE_DCHECK_GT(n, 0);

  const T* ii = value.unsafe_data();
  const int bytes = n * sizeof(ii[0]);
  memcpy(target, ii, bytes);
  return target + bytes;
#else
  return WritePrimitiveNoTagToArray(value, Writer, target);
#endif
}